

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

void __thiscall rw::Clump::render(Clump *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  Atomic *this_00;
  LLLink *local_28;
  LLLink *lnk;
  LLLink *_next;
  Atomic *a;
  Clump *this_local;
  
  local_28 = (this->atomics).link.next;
  while( true ) {
    pLVar1 = local_28->next;
    pLVar2 = LinkList::end(&this->atomics);
    if (local_28 == pLVar2) break;
    this_00 = Atomic::fromClump(local_28);
    local_28 = pLVar1;
    if (((this_00->object).object.flags & 4) != 0) {
      Atomic::render(this_00);
    }
  }
  return;
}

Assistant:

void
Clump::render(void)
{
	Atomic *a;
	FORLIST(lnk, this->atomics){
		a = Atomic::fromClump(lnk);
		if(a->object.object.flags & Atomic::RENDER)
			a->render();
	}
}